

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeSymbol.cpp
# Opt level: O2

span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>
slang::ast::AttributeSymbol::fromSyntax
          (span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax,
          Scope *scope,LookupLocation lookupLocation)

{
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *pSVar1;
  Token *this;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  bool bVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  AttributeSpecSyntax *pAVar13;
  ConstantValue *args_2;
  uint64_t uVar14;
  Diagnostic *this_00;
  undefined4 extraout_var;
  pointer ppAVar16;
  EVP_PKEY_CTX *extraout_RDX;
  ulong uVar17;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_02;
  size_t extraout_RDX_03;
  ulong uVar18;
  long lVar19;
  __extent_storage<18446744073709551615UL> _Var20;
  long lVar21;
  Compilation *this_01;
  pointer ppAVar22;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  ulong pos0;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  string_view sVar25;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar26;
  try_emplace_args_t local_201;
  AttributeSymbol *attr;
  string_view name;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_1d8 [2];
  Scope *local_1c8;
  pointer local_1c0;
  const_iterator __begin3;
  LookupLocation lookupLocation_local;
  ConstantValue value;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
  nameMap;
  SmallVector<const_slang::ast::AttributeSymbol_*,_5UL> attrs;
  pointer ppAVar15;
  
  ppAVar22 = syntax._M_ptr;
  lookupLocation_local.scope = lookupLocation.scope;
  lookupLocation_local.index = lookupLocation.index;
  if (syntax._M_extent._M_extent_value._M_extent_value == 0) {
    _Var20._M_extent_value = 0;
    ppAVar15 = (pointer)0x0;
  }
  else {
    SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
    ::SmallMap(&nameMap);
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_ =
         (pointer)attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.firstElement;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.len = 0;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.cap = 5;
    this_01 = scope->compilation;
    ppAVar16 = ppAVar22 + syntax._M_extent._M_extent_value._M_extent_value;
    src = extraout_RDX;
    local_1c8 = scope;
    for (; ppAVar22 != ppAVar16; ppAVar22 = ppAVar22 + 1) {
      pSVar1 = &(*ppAVar22)->specs;
      __begin3.index = 0;
      sVar3 = ((*ppAVar22)->specs).elements._M_extent._M_extent_value;
      local_1c0 = ppAVar22;
      __begin3.list = pSVar1;
      for (; (__begin3.list != pSVar1 || (__begin3.index != sVar3 + 1 >> 1));
          __begin3.index = __begin3.index + 1) {
        pAVar13 = slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::
                  iterator_base<const_slang::syntax::AttributeSpecSyntax_*>::dereference(&__begin3);
        this = &pAVar13->name;
        sVar25 = parsing::Token::valueText(this);
        src = (EVP_PKEY_CTX *)sVar25._M_str;
        name = sVar25;
        if (sVar25._M_len != 0) {
          if (pAVar13->value == (EqualsValueClauseSyntax *)0x0) {
            SVInt::SVInt((SVInt *)local_1d8,1,1,false);
            std::
            variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
            ::variant<slang::SVInt,void,void,slang::SVInt,void>
                      ((variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        *)&value,(SVInt *)local_1d8);
            SVInt::~SVInt((SVInt *)local_1d8);
            local_1d8[0] = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                           parsing::Token::location(this);
            args_2 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                               (&this_01->constantAllocator,&value);
            attr = BumpAllocator::
                   emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ConstantValue&>
                             (&this_01->super_BumpAllocator,&name,(SourceLocation *)local_1d8,args_2
                             );
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&value);
          }
          else {
            local_1d8[0] = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                           parsing::Token::location(this);
            value.value.
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._M_u._M_rest._0_16_ = (undefined1  [16])(undefined1  [16])sVar25;
            attr = BumpAllocator::
                   emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Scope_const&,slang::ast::LookupLocation&,slang::syntax::ExpressionSyntax&>
                             (&this_01->super_BumpAllocator,
                              (basic_string_view<char,_std::char_traits<char>_> *)&value,
                              (SourceLocation *)local_1d8,scope,&lookupLocation_local,
                              (pAVar13->value->expr).ptr);
          }
          (attr->super_Symbol).originatingSyntax = &pAVar13->super_SyntaxNode;
          uVar14 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &nameMap.super_Storage.field_0x68,&name);
          uVar18 = uVar14 >> (nameMap._112_1_ & 0x3f);
          lVar19 = (uVar14 & 0xff) * 4;
          cVar5 = (&UNK_0049e39c)[lVar19];
          cVar6 = (&UNK_0049e39d)[lVar19];
          cVar7 = (&UNK_0049e39e)[lVar19];
          bVar8 = (&UNK_0049e39f)[lVar19];
          uVar17 = 0;
          do {
            pcVar2 = (char *)(nameMap._128_8_ + uVar18 * 0x10);
            bVar10 = pcVar2[0xf];
            auVar23[0] = -(*pcVar2 == cVar5);
            auVar23[1] = -(pcVar2[1] == cVar6);
            auVar23[2] = -(pcVar2[2] == cVar7);
            auVar23[3] = -(pcVar2[3] == bVar8);
            auVar23[4] = -(pcVar2[4] == cVar5);
            auVar23[5] = -(pcVar2[5] == cVar6);
            auVar23[6] = -(pcVar2[6] == cVar7);
            auVar23[7] = -(pcVar2[7] == bVar8);
            auVar23[8] = -(pcVar2[8] == cVar5);
            auVar23[9] = -(pcVar2[9] == cVar6);
            auVar23[10] = -(pcVar2[10] == cVar7);
            auVar23[0xb] = -(pcVar2[0xb] == bVar8);
            auVar23[0xc] = -(pcVar2[0xc] == cVar5);
            auVar23[0xd] = -(pcVar2[0xd] == cVar6);
            auVar23[0xe] = -(pcVar2[0xe] == cVar7);
            auVar23[0xf] = -(bVar10 == bVar8);
            uVar11 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
            if (uVar11 != 0) {
              lVar21 = nameMap._128_8_ + uVar18 * 0x10;
              lVar19 = nameMap._136_8_ + uVar18 * 0x168;
              do {
                uVar4 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                  }
                }
                __y = (basic_string_view<char,_std::char_traits<char>_> *)
                      ((ulong)uVar4 * 0x18 + lVar19);
                bVar9 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    *)&nameMap.super_Storage.field_0x68,&name,__y);
                scope = local_1c8;
                if (bVar9) {
                  this_00 = Scope::addDiag(local_1c8,(DiagCode)0xed0006,
                                           (attr->super_Symbol).location);
                  ppAVar22 = local_1c0;
                  Diagnostic::operator<<(this_00,name);
                  attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_
                  [__y[1]._M_len] = attr;
                  src = (EVP_PKEY_CTX *)
                        attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_;
                  goto LAB_0047cc50;
                }
                uVar11 = uVar11 - 1 & uVar11;
              } while (uVar11 != 0);
              bVar10 = *(byte *)(lVar21 + 0xf);
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7] & bVar10) == 0) break;
            lVar19 = uVar18 + uVar17;
            uVar17 = uVar17 + 1;
            uVar18 = lVar19 + 1U & nameMap._120_8_;
          } while (uVar17 <= (ulong)nameMap._120_8_);
          SmallVectorBase<slang::ast::AttributeSymbol_const*>::
          emplace_back<slang::ast::AttributeSymbol_const*const&>
                    ((SmallVectorBase<slang::ast::AttributeSymbol_const*> *)&attrs,&attr);
          local_1d8[0].pVal =
               (uint64_t *)
               (attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.len - 1);
          uVar14 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &nameMap.super_Storage.field_0x68,&name);
          pos0 = uVar14 >> (nameMap._112_1_ & 0x3f);
          lVar19 = (uVar14 & 0xff) * 4;
          cVar5 = (&UNK_0049e39c)[lVar19];
          cVar6 = (&UNK_0049e39d)[lVar19];
          cVar7 = (&UNK_0049e39e)[lVar19];
          bVar8 = (&UNK_0049e39f)[lVar19];
          uVar18 = 0;
          uVar17 = pos0;
          do {
            pcVar2 = (char *)(nameMap._128_8_ + uVar17 * 0x10);
            bVar10 = pcVar2[0xf];
            auVar24[0] = -(*pcVar2 == cVar5);
            auVar24[1] = -(pcVar2[1] == cVar6);
            auVar24[2] = -(pcVar2[2] == cVar7);
            auVar24[3] = -(pcVar2[3] == bVar8);
            auVar24[4] = -(pcVar2[4] == cVar5);
            auVar24[5] = -(pcVar2[5] == cVar6);
            auVar24[6] = -(pcVar2[6] == cVar7);
            auVar24[7] = -(pcVar2[7] == bVar8);
            auVar24[8] = -(pcVar2[8] == cVar5);
            auVar24[9] = -(pcVar2[9] == cVar6);
            auVar24[10] = -(pcVar2[10] == cVar7);
            auVar24[0xb] = -(pcVar2[0xb] == bVar8);
            auVar24[0xc] = -(pcVar2[0xc] == cVar5);
            auVar24[0xd] = -(pcVar2[0xd] == cVar6);
            auVar24[0xe] = -(pcVar2[0xe] == cVar7);
            auVar24[0xf] = -(bVar10 == bVar8);
            uVar11 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
            if (uVar11 != 0) {
              lVar21 = nameMap._128_8_ + uVar17 * 0x10;
              lVar19 = nameMap._136_8_ + uVar17 * 0x168;
              do {
                uVar4 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                  }
                }
                bVar9 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    *)&nameMap.super_Storage.field_0x68,&name,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   ((ulong)uVar4 * 0x18 + lVar19));
                src = extraout_RDX_00;
                ppAVar22 = local_1c0;
                scope = local_1c8;
                if (bVar9) goto LAB_0047cc50;
                uVar11 = uVar11 - 1 & uVar11;
              } while (uVar11 != 0);
              bVar10 = *(byte *)(lVar21 + 0xf);
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7] & bVar10) == 0) break;
            lVar19 = uVar17 + uVar18;
            uVar18 = uVar18 + 1;
            uVar17 = lVar19 + 1U & nameMap._120_8_;
          } while (uVar18 <= (ulong)nameMap._120_8_);
          if ((ulong)nameMap._152_8_ < (ulong)nameMap._144_8_) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
            ::
            unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                      ((locator *)&value,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                        *)&nameMap.super_Storage.field_0x68,pos0,uVar14,&local_201,&name,
                       &local_1d8[0].val);
            src = extraout_RDX_01;
            ppAVar22 = local_1c0;
            scope = local_1c8;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                      ((locator *)&value,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                        *)&nameMap.super_Storage.field_0x68,uVar14,&local_201,&name,
                       &local_1d8[0].val);
            src = extraout_RDX_02;
            ppAVar22 = local_1c0;
            scope = local_1c8;
          }
        }
LAB_0047cc50:
      }
    }
    iVar12 = SmallVectorBase<const_slang::ast::AttributeSymbol_*>::copy
                       (&attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>,
                        (EVP_PKEY_CTX *)this_01,src);
    ppAVar15 = (pointer)CONCAT44(extraout_var,iVar12);
    SmallVectorBase<const_slang::ast::AttributeSymbol_*>::cleanup
              (&attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>,
               (EVP_PKEY_CTX *)this_01);
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
    ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                   *)&nameMap.super_Storage.field_0x68);
    _Var20._M_extent_value = extraout_RDX_03;
  }
  sVar26._M_extent._M_extent_value = _Var20._M_extent_value;
  sVar26._M_ptr = ppAVar15;
  return sVar26;
}

Assistant:

std::span<const AttributeSymbol* const> AttributeSymbol::fromSyntax(
    std::span<const AttributeInstanceSyntax* const> syntax, const Scope& scope,
    LookupLocation lookupLocation) {

    if (syntax.empty())
        return {};

    return createAttributes(
        syntax, scope,
        [&scope, &lookupLocation](auto& comp, auto name, auto loc, auto& exprSyntax) {
            return comp.template emplace<AttributeSymbol>(name, loc, scope, lookupLocation,
                                                          exprSyntax);
        });
}